

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO_Action_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::IO_Action_PDU::ClearStandardVariableRecords(IO_Action_PDU *this)

{
  IO_Action_PDU *this_local;
  
  (this->super_IO_Header).super_Header.super_Header6.m_ui16PDULength = 0x38;
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  ::clear(&this->m_vStdVarRecs);
  this->m_ui16NumStdVarRec = 0;
  return;
}

Assistant:

void IO_Action_PDU::ClearStandardVariableRecords()
{
    // Reset the PDU length.
    m_ui16PDULength = IO_ACTION_PDU_SIZE;

    m_vStdVarRecs.clear();
    m_ui16NumStdVarRec = 0;
}